

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O1

Graph * Omega_h::edges_across_tris(Graph *__return_storage_ptr__,Adj *f2e,Adj *e2f)

{
  size_type *psVar1;
  int *piVar2;
  long lVar3;
  undefined4 uVar4;
  long lVar5;
  void *pvVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  Alloc **__dest;
  uint uVar10;
  ulong *puVar11;
  int iVar12;
  Graph *pGVar13;
  Alloc *pAVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  LOs e2ef;
  type functor;
  Write<int> ee2e;
  LOs e2ee;
  Read<signed_char> e2ef_codes;
  LOs ef2f;
  LOs fe2e;
  size_type __dnew;
  Read<int> e2ee_degrees;
  LOs e2ef_degrees;
  ScopedTimer local_272;
  ScopedTimer local_271;
  size_t local_270;
  undefined1 local_268 [32];
  Alloc *local_248;
  void *local_240;
  Alloc *local_238;
  void *local_230;
  Alloc *local_228;
  void *local_220;
  Alloc *local_218;
  void *local_210;
  Alloc **local_200;
  Alloc *local_1f8;
  Alloc *local_1f0 [2];
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  Alloc *local_1c0;
  void *local_1b8;
  Alloc *local_1b0;
  void *local_1a8;
  undefined1 local_1a0 [32];
  Alloc *local_180;
  void *local_178;
  Alloc *local_170;
  void *local_168;
  Alloc *local_160;
  void *pvStack_158;
  Write<int> local_150;
  Read<int> local_140;
  Alloc *local_130;
  void *local_128;
  Alloc *local_120;
  void *local_118;
  Alloc *local_110;
  void *local_108;
  Alloc *local_100;
  long local_f8;
  undefined1 local_f0 [48];
  LOs local_c0;
  Read<int> local_b0;
  LOs local_a0;
  Write<int> local_90;
  void *local_80;
  Alloc *local_78;
  Read<signed_char> local_70;
  Read<int> local_60;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  void *local_38;
  
  local_1e0 = &local_1d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  pAVar14 = (Alloc *)(plVar8 + 2);
  if ((Alloc *)*plVar8 == pAVar14) {
    local_1a0._0_8_ = pAVar14->size;
    local_1a0._8_8_ = plVar8[3];
    local_1b0 = (Alloc *)local_1a0;
  }
  else {
    local_1a0._0_8_ = pAVar14->size;
    local_1b0 = (Alloc *)*plVar8;
  }
  local_1a8 = (void *)plVar8[1];
  *plVar8 = (long)pAVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_200,3,0x215);
  pAVar14 = (Alloc *)0xf;
  if (local_1b0 != (Alloc *)local_1a0) {
    pAVar14 = (Alloc *)local_1a0._0_8_;
  }
  if (pAVar14 < (Alloc *)((long)local_1f8 + (long)local_1a8)) {
    pAVar14 = (Alloc *)0xf;
    if (local_200 != local_1f0) {
      pAVar14 = local_1f0[0];
    }
    if (pAVar14 < (Alloc *)((long)local_1f8 + (long)local_1a8)) goto LAB_001d1eda;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_001d1eda:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_200);
  }
  local_268._0_8_ = local_268 + 0x10;
  psVar1 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar1) {
    local_268._16_8_ = *psVar1;
    local_268._24_8_ = puVar9[3];
  }
  else {
    local_268._16_8_ = *psVar1;
    local_268._0_8_ = (size_type *)*puVar9;
  }
  local_268._8_8_ = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(char *)psVar1 = '\0';
  begin_code("edges_across_tris",(char *)local_268._0_8_);
  plVar8 = (long *)(local_268 + 0x10);
  if ((long *)local_268._0_8_ != plVar8) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,(ulong)((long)&local_1f0[0]->size + 1));
  }
  if (local_1b0 != (Alloc *)local_1a0) {
    operator_delete(local_1b0,(ulong)((long)(size_t *)local_1a0._0_8_ + 1));
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  local_110 = (f2e->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_110 = (Alloc *)(local_110->size * 8 + 1);
    }
    else {
      local_110->use_count = local_110->use_count + 1;
    }
  }
  local_108 = (f2e->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_1c0 = (e2f->super_Graph).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_1c0 & 7) == 0 && local_1c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c0 = (Alloc *)(local_1c0->size * 8 + 1);
    }
    else {
      local_1c0->use_count = local_1c0->use_count + 1;
    }
  }
  local_1b8 = (e2f->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  local_120 = (e2f->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120 = (Alloc *)(local_120->size * 8 + 1);
    }
    else {
      local_120->use_count = local_120->use_count + 1;
    }
  }
  local_118 = (e2f->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_130 = (e2f->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_130 = (Alloc *)(local_130->size * 8 + 1);
    }
    else {
      local_130->use_count = local_130->use_count + 1;
    }
  }
  local_128 = (e2f->codes).write_.shared_alloc_.direct_ptr;
  if (((ulong)local_1c0 & 1) == 0) {
    local_270 = local_1c0->size;
  }
  else {
    local_270 = (ulong)local_1c0 >> 3;
  }
  local_a0.write_.shared_alloc_.alloc = local_1c0;
  if (((ulong)local_1c0 & 7) == 0 && local_1c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_1c0->size * 8 + 1);
    }
    else {
      local_1c0->use_count = local_1c0->use_count + 1;
    }
  }
  local_268._0_8_ = plVar8;
  local_a0.write_.shared_alloc_.direct_ptr = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"");
  get_degrees((Omega_h *)&local_40,&local_a0,(string *)local_268);
  if ((long *)local_268._0_8_ != plVar8) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  pAVar14 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar14,0x48);
    }
  }
  local_60.write_.shared_alloc_.alloc = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = local_38;
  local_f0._32_8_ = (Omega_h *)&local_40;
  multiply_each_by<int>((Omega_h *)&local_50,&local_60,2);
  pAVar14 = local_60.write_.shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(pAVar14,0x48);
    }
  }
  local_b0.write_.shared_alloc_.alloc = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.write_.shared_alloc_.alloc = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_b0.write_.shared_alloc_.direct_ptr = local_48;
  local_268._0_8_ = plVar8;
  local_f0._24_8_ = (Omega_h *)&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"edges to edge edges","");
  offset_scan<int>((Omega_h *)&local_140,&local_b0,(string *)local_268);
  if ((long *)local_268._0_8_ != plVar8) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  pAVar14 = local_b0.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
      operator_delete(pAVar14,0x48);
    }
  }
  local_f0._16_8_ = &local_140;
  iVar7 = Read<int>::last((Read<int> *)local_f0._16_8_);
  local_268._0_8_ = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"edge edges to edges","");
  Write<int>::Write(&local_150,iVar7,(string *)local_268);
  if ((long *)local_268._0_8_ != plVar8) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  local_1b0 = local_1c0;
  if (((ulong)local_1c0 & 7) == 0 && local_1c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b0 = (Alloc *)(local_1c0->size * 8 + 1);
    }
    else {
      local_1c0->use_count = local_1c0->use_count + 1;
    }
  }
  local_1a8 = local_1b8;
  local_1a0._0_8_ = local_140.write_.shared_alloc_.alloc;
  if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a0._0_8_ = (local_140.write_.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_140.write_.shared_alloc_.alloc)->use_count =
           (local_140.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1a0._8_8_ = local_140.write_.shared_alloc_.direct_ptr;
  local_1a0._16_8_ = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a0._16_8_ = local_120->size * 8 + 1;
    }
    else {
      local_120->use_count = local_120->use_count + 1;
    }
  }
  local_1a0._24_8_ = local_118;
  local_180 = local_130;
  if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_180 = (Alloc *)(local_130->size * 8 + 1);
    }
    else {
      local_130->use_count = local_130->use_count + 1;
    }
  }
  local_178 = local_128;
  local_170 = local_110;
  if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_170 = (Alloc *)(local_110->size * 8 + 1);
    }
    else {
      local_110->use_count = local_110->use_count + 1;
    }
  }
  local_168 = local_108;
  local_160 = local_150.shared_alloc_.alloc;
  if (((ulong)local_150.shared_alloc_.alloc & 7) == 0 &&
      local_150.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_160 = (Alloc *)((local_150.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_150.shared_alloc_.alloc)->use_count = (local_150.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_158 = local_150.shared_alloc_.direct_ptr;
  local_200 = local_1f0;
  local_100 = (Alloc *)0x5d;
  local_f0._40_8_ = __return_storage_ptr__;
  __dest = (Alloc **)std::__cxx11::string::_M_create((ulong *)&local_200,(ulong)&local_100);
  pAVar14 = local_100;
  local_1f0[0] = local_100;
  local_200 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_1f8 = pAVar14;
  *(undefined1 *)((long)__dest + (long)pAVar14) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_200);
  pGVar13 = (Graph *)local_f0._40_8_;
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_1d0 = *puVar11;
    lStack_1c8 = plVar8[3];
    local_1e0 = &local_1d0;
  }
  else {
    local_1d0 = *puVar11;
    local_1e0 = (ulong *)*plVar8;
  }
  local_1d8 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_100 = (Alloc *)local_f0;
  std::__cxx11::string::_M_construct((ulong)&local_100,'\x02');
  *(undefined2 *)&local_100->size = 0x3438;
  uVar17 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar17 = local_1d0;
  }
  if (uVar17 < (ulong)(local_f8 + local_1d8)) {
    uVar17 = 0xf;
    if (local_100 != (Alloc *)local_f0) {
      uVar17 = local_f0._0_8_;
    }
    if ((ulong)(local_f8 + local_1d8) <= uVar17) {
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_100,0,(char *)0x0,(ulong)local_1e0);
      goto LAB_001d273c;
    }
  }
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_100);
LAB_001d273c:
  pAVar14 = (Alloc *)(plVar8 + 2);
  if ((Alloc *)*plVar8 == pAVar14) {
    local_268._16_8_ = pAVar14->size;
    local_268._24_8_ = plVar8[3];
    local_268._0_8_ = (Alloc *)(local_268 + 0x10);
  }
  else {
    local_268._16_8_ = pAVar14->size;
    local_268._0_8_ = (Alloc *)*plVar8;
  }
  local_268._8_8_ = plVar8[1];
  *plVar8 = (long)pAVar14;
  plVar8[1] = 0;
  *(undefined1 *)&pAVar14->size = 0;
  begin_code("parallel_for",(char *)local_268._0_8_);
  if ((Alloc *)local_268._0_8_ != (Alloc *)(local_268 + 0x10)) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  if (local_100 != (Alloc *)local_f0) {
    operator_delete(local_100,local_f0._0_8_ + 1);
  }
  local_270 = local_270 >> 2;
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,(ulong)((long)&local_1f0[0]->size + 1));
  }
  pvVar6 = pvStack_158;
  if (1 < (int)local_270) {
    local_268._0_8_ = local_1b0;
    if (((ulong)local_1b0 & 7) == 0 && local_1b0 != (Alloc *)0x0) {
      local_268._0_8_ = local_1b0->size * 8 + 1;
    }
    local_268._8_8_ = local_1a8;
    local_268._16_8_ = local_1a0._0_8_;
    if ((local_1a0._0_8_ & 7) == 0 && (Alloc *)local_1a0._0_8_ != (Alloc *)0x0) {
      local_268._16_8_ = *(size_t *)local_1a0._0_8_ * 8 + 1;
    }
    local_78 = (Alloc *)local_1a0._8_8_;
    local_268._24_8_ = local_1a0._8_8_;
    local_248 = (Alloc *)local_1a0._16_8_;
    if ((local_1a0._16_8_ & 7) == 0 && (Alloc *)local_1a0._16_8_ != (Alloc *)0x0) {
      local_248 = (Alloc *)(*(size_t *)local_1a0._16_8_ * 8 + 1);
    }
    local_80 = (void *)local_1a0._24_8_;
    local_240 = (void *)local_1a0._24_8_;
    local_238 = local_180;
    if (((ulong)local_180 & 7) == 0 && local_180 != (Alloc *)0x0) {
      local_238 = (Alloc *)(local_180->size * 8 + 1);
    }
    local_230 = local_178;
    local_228 = local_170;
    if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
      local_228 = (Alloc *)(local_170->size * 8 + 1);
    }
    local_220 = local_168;
    local_218 = local_160;
    local_210 = pvStack_158;
    if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
      local_160->use_count = local_160->use_count + -1;
      local_218 = (Alloc *)(local_160->size * 8 + 1);
    }
    uVar10 = (int)local_270 - 1;
    local_270 = (size_t)uVar10;
    local_160 = (Alloc *)0x0;
    pvStack_158 = (void *)0x0;
    entering_parallel = '\0';
    lVar15 = 0;
    do {
      iVar7 = *(int *)((long)local_1a8 + lVar15 * 4);
      iVar12 = *(int *)((long)local_1a8 + lVar15 * 4 + 4);
      uVar16 = iVar12 - iVar7;
      if (uVar16 != 0 && iVar7 <= iVar12) {
        lVar3 = (long)*(int *)((long)(size_t *)local_1a0._8_8_ + lVar15 * 4) * 4;
        uVar17 = 0;
        do {
          iVar12 = (int)(*(char *)((long)local_178 + uVar17 + (long)iVar7) >> 3);
          lVar5 = (long)*(int *)(local_1a0._24_8_ + uVar17 * 4 + (long)iVar7 * 4) * 3;
          uVar4 = *(undefined4 *)
                   ((long)local_168 + (long)(((iVar12 + 2) / 3) * -3 + iVar12 + 2 + (int)lVar5) * 4)
          ;
          *(undefined4 *)((long)pvVar6 + uVar17 * 8 + lVar3) =
               *(undefined4 *)
                ((long)local_168 + ((((iVar12 + 1) / 3) * -3 + iVar12 + 1) + lVar5) * 4);
          *(undefined4 *)((long)pvVar6 + uVar17 * 8 + lVar3 + 4) = uVar4;
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
      lVar15 = lVar15 + 1;
    } while (uVar10 != (uint)lVar15);
    edges_across_tris(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)local_268);
    pGVar13 = (Graph *)local_f0._40_8_;
  }
  ScopedTimer::~ScopedTimer(&local_271);
  local_c0.write_.shared_alloc_.alloc = local_140.write_.shared_alloc_.alloc;
  if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.write_.shared_alloc_.alloc =
           (Alloc *)((local_140.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_140.write_.shared_alloc_.alloc)->use_count =
           (local_140.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0.write_.shared_alloc_.direct_ptr = local_140.write_.shared_alloc_.direct_ptr;
  local_90.shared_alloc_.alloc = local_150.shared_alloc_.alloc;
  if (((ulong)local_150.shared_alloc_.alloc & 7) == 0 &&
      local_150.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.shared_alloc_.alloc = (Alloc *)((local_150.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_150.shared_alloc_.alloc)->use_count = (local_150.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.shared_alloc_.direct_ptr = local_150.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_70,&local_90);
  Adj::Adj((Adj *)local_268,&local_c0,(LOs *)&local_70);
  (pGVar13->a2ab).write_.shared_alloc_.alloc = (Alloc *)local_268._0_8_;
  (pGVar13->a2ab).write_.shared_alloc_.direct_ptr = (void *)local_268._8_8_;
  if (((local_268._0_8_ & 7) == 0 && (Alloc *)local_268._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_268._0_8_ + 0x30) = *(int *)(local_268._0_8_ + 0x30) + -1;
    (pGVar13->a2ab).write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_268._0_8_ * 8 + 1);
  }
  local_268._0_8_ = (pointer)0x0;
  local_268._8_8_ = (void *)0x0;
  (pGVar13->ab2b).write_.shared_alloc_.alloc = (Alloc *)local_268._16_8_;
  (pGVar13->ab2b).write_.shared_alloc_.direct_ptr = (void *)local_268._24_8_;
  if (((local_268._16_8_ & 7) == 0 && (Alloc *)local_268._16_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_268._16_8_ + 0x30) = *(int *)(local_268._16_8_ + 0x30) + -1;
    (pGVar13->ab2b).write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_268._16_8_ * 8 + 1);
  }
  local_268._16_8_ = 0;
  local_268._24_8_ = 0;
  Adj::~Adj((Adj *)local_268);
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(local_70.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar14 = local_90.shared_alloc_.alloc;
  if (((ulong)local_90.shared_alloc_.alloc & 7) == 0 && local_90.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_90.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_90.shared_alloc_.alloc);
      operator_delete(pAVar14,0x48);
    }
  }
  pAVar14 = local_c0.write_.shared_alloc_.alloc;
  if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
      operator_delete(pAVar14,0x48);
    }
  }
  edges_across_tris(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)&local_1b0);
  if (((ulong)local_150.shared_alloc_.alloc & 7) == 0 &&
      local_150.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_150.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_150.shared_alloc_.alloc);
      operator_delete(local_150.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_140.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
      operator_delete(local_140.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    piVar2 = &local_50->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_50);
      operator_delete(local_50,0x48);
    }
  }
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar2 = &local_40->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(local_40,0x48);
    }
  }
  pAVar14 = local_130;
  if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
    piVar2 = &local_130->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_130);
      operator_delete(pAVar14,0x48);
    }
  }
  pAVar14 = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    piVar2 = &local_120->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_120);
      operator_delete(pAVar14,0x48);
    }
  }
  pAVar14 = local_1c0;
  if (((ulong)local_1c0 & 7) == 0 && local_1c0 != (Alloc *)0x0) {
    piVar2 = &local_1c0->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1c0);
      operator_delete(pAVar14,0x48);
    }
  }
  pAVar14 = local_110;
  if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
    piVar2 = &local_110->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_110);
      operator_delete(pAVar14,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_272);
  return pGVar13;
}

Assistant:

Graph edges_across_tris(Adj const f2e, Adj const e2f) {
  OMEGA_H_TIME_FUNCTION;
  auto const fe2e = f2e.ab2b;
  auto const e2ef = e2f.a2ab;
  auto const ef2f = e2f.ab2b;
  auto const e2ef_codes = e2f.codes;
  auto const ne = e2ef.size() - 1;
  auto const e2ef_degrees = get_degrees(e2ef);
  auto const e2ee_degrees = multiply_each_by(e2ef_degrees, 2);
  auto const e2ee = offset_scan(e2ee_degrees, "edges to edge edges");
  auto const nee = e2ee.last();
  Write<LO> ee2e(nee, "edge edges to edges");
  auto functor = OMEGA_H_LAMBDA(LO e) {
    auto const ef_begin = e2ef[e];
    auto const ef_end = e2ef[e + 1];
    auto const neef = ef_end - ef_begin;
    auto const ee_begin = e2ee[e];
    for (Int eef = 0; eef < neef; ++eef) {
      auto const ef = ef_begin + eef;
      auto const f = ef2f[ef];
      auto const e2ef_code = e2ef_codes[ef];
      auto const ffe = code_which_down(e2ef_code);
      auto const e1 = fe2e[f * 3 + ((ffe + 1) % 3)];
      auto const e2 = fe2e[f * 3 + ((ffe + 2) % 3)];
      ee2e[ee_begin + eef * 2 + 0] = e1;
      ee2e[ee_begin + eef * 2 + 1] = e2;
    }
  };
  parallel_for(ne, std::move(functor));
  return Adj(e2ee, ee2e);
}